

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
          (ModelBaseEKFFlexEstimatorIMU *this,double d)

{
  DiagonalReturnType local_78;
  Type local_68;
  Pmatrix local_30;
  double local_18;
  double d_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  this->unmodeledForceVariance_ = d;
  local_18 = d;
  d_local = (double)this;
  if (0.0 < d) {
    setWithUnmodeledForces(this,true);
  }
  KalmanFilterBase::getStateCovariance
            (&local_30,&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->P_,&local_30);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_30);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
            (&local_78,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P_);
  Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>::segment<6>
            (&local_68,
             (DenseBase<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)&local_78,
             0x18,6);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_6,_1,_false>_>
  ::setConstant((DenseBase<Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_6,_1,_false>_>
                 *)&local_68,&this->unmodeledForceVariance_);
  KalmanFilterBase::setStateCovariance
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,&this->P_);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }